

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::TryExpr::~TryExpr(TryExpr *this)

{
  Expr *pEVar1;
  pointer pTVar2;
  pointer pcVar3;
  _func_int ***ppp_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  *(undefined ***)this = &PTR__TryExpr_0023f3a0;
  Var::~Var(&this->delegate_target);
  std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&this->catches);
  pEVar1 = (this->block).exprs.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var4 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  (this->block).exprs.first_ = (Expr *)0x0;
  (this->block).exprs.last_ = (Expr *)0x0;
  (this->block).exprs.size_ = 0;
  pTVar2 = (this->block).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)(this->block).decl.sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar2);
  }
  pTVar2 = (this->block).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)(this->block).decl.sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar2);
  }
  Var::~Var(&(this->block).decl.type_var);
  pcVar3 = (this->block).label._M_dataplus._M_p;
  paVar5 = &(this->block).label.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar5) {
    return;
  }
  operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc), kind(TryKind::Plain) {}